

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

int __thiscall glcts::LayoutBindingTests::init(LayoutBindingTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  int extraout_EAX;
  StageType (*in_RDX) [3];
  LayoutBindingParameters (*data) [7];
  LayoutBindingParameters *testArgs;
  undefined1 *this_00;
  pointer stageType;
  StageType stage;
  StageType stage_00;
  StageType stage_01;
  StageType stage_02;
  StageType stage_03;
  String testName;
  vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_> samplers;
  vector<glcts::StageType,_std::allocator<glcts::StageType>_> stages;
  
  makeVector<glcts::StageType,3ul>(&stages,(glcts *)stageTypes,in_RDX);
  this_00 = test_args;
  makeVector<glcts::LayoutBindingParameters,7ul>(&samplers,(glcts *)test_args,data);
  stageType = stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>._M_impl
              .super__Vector_impl_data._M_start;
  do {
    testArgs = samplers.
               super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (stageType ==
        stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
      ::~_Vector_base(&samplers.
                       super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                     );
      std::_Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>::~_Vector_base
                (&stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>);
      return extraout_EAX;
    }
    for (; testArgs !=
           samplers.
           super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish; testArgs = testArgs + 1) {
      createTestName_abi_cxx11_(&testName,(LayoutBindingTests *)this_00,stageType,testArgs);
      switch(testArgs->surface_type) {
      case AtomicCounter:
        this_00 = (undefined1 *)operator_new(0x228);
        uVar1 = stageType->name;
        uVar2 = stageType->type;
        stage.type = uVar2;
        stage.name = (char *)uVar1;
        stage._12_4_ = 0;
        AtomicCounterLayoutBindingCase::AtomicCounterLayoutBindingCase
                  ((AtomicCounterLayoutBindingCase *)this_00,(this->super_TestCaseGroup).m_context,
                   testName._M_dataplus._M_p,"test atomic counters layout binding functionality",
                   stage,testArgs,this->m_glslVersion);
        break;
      case Texture:
        this_00 = (undefined1 *)operator_new(0x228);
        uVar9 = stageType->name;
        uVar10 = stageType->type;
        stage_03.type = uVar10;
        stage_03.name = (char *)uVar9;
        stage_03._12_4_ = 0;
        SamplerLayoutBindingCase::SamplerLayoutBindingCase
                  ((SamplerLayoutBindingCase *)this_00,(this->super_TestCaseGroup).m_context,
                   testName._M_dataplus._M_p,"test sampler layout binding functionality",stage_03,
                   testArgs,this->m_glslVersion);
        break;
      case Image:
        this_00 = (undefined1 *)operator_new(0x228);
        uVar5 = stageType->name;
        uVar6 = stageType->type;
        stage_01.type = uVar6;
        stage_01.name = (char *)uVar5;
        stage_01._12_4_ = 0;
        ImageLayoutBindingCase::ImageLayoutBindingCase
                  ((ImageLayoutBindingCase *)this_00,(this->super_TestCaseGroup).m_context,
                   testName._M_dataplus._M_p,"test image layout binding functionality",stage_01,
                   testArgs,this->m_glslVersion);
        break;
      case UniformBlock:
        this_00 = (undefined1 *)operator_new(0x228);
        uVar7 = stageType->name;
        uVar8 = stageType->type;
        stage_02.type = uVar8;
        stage_02.name = (char *)uVar7;
        stage_02._12_4_ = 0;
        UniformBlocksLayoutBindingCase::UniformBlocksLayoutBindingCase
                  ((UniformBlocksLayoutBindingCase *)this_00,(this->super_TestCaseGroup).m_context,
                   testName._M_dataplus._M_p,"test uniform block layout binding functionality",
                   stage_02,testArgs,this->m_glslVersion);
        break;
      case ShaderStorageBuffer:
        this_00 = (undefined1 *)operator_new(0x228);
        uVar3 = stageType->name;
        uVar4 = stageType->type;
        stage_00.type = uVar4;
        stage_00.name = (char *)uVar3;
        stage_00._12_4_ = 0;
        ShaderStorageBufferLayoutBindingCase::ShaderStorageBufferLayoutBindingCase
                  ((ShaderStorageBufferLayoutBindingCase *)this_00,
                   (this->super_TestCaseGroup).m_context,testName._M_dataplus._M_p,
                   "test shader storage buffer layout binding functionality",stage_00,testArgs,
                   this->m_glslVersion);
        break;
      default:
        goto switchD_00be8e54_default;
      }
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
switchD_00be8e54_default:
      std::__cxx11::string::~string((string *)&testName);
    }
    stageType = stageType + 1;
  } while( true );
}

Assistant:

void LayoutBindingTests::init(void)
{
	std::vector<StageType>				 stages   = makeVector(stageTypes);
	std::vector<LayoutBindingParameters> samplers = makeVector(test_args);
	for (std::vector<StageType>::iterator stagesIter = stages.begin(); stagesIter != stages.end(); stagesIter++)
	{
		for (std::vector<LayoutBindingParameters>::iterator testArgsIter = samplers.begin();
			 testArgsIter != samplers.end(); testArgsIter++)
		{
			String testName = createTestName(*stagesIter, *testArgsIter);
			switch ((*testArgsIter).surface_type)
			{
			case Texture:
				addChild(new SamplerLayoutBindingCase(m_context, testName.c_str(),
													  "test sampler layout binding functionality", *stagesIter,
													  *testArgsIter, m_glslVersion));
				break;
			case Image:
				addChild(new ImageLayoutBindingCase(m_context, testName.c_str(),
													"test image layout binding functionality", *stagesIter,
													*testArgsIter, m_glslVersion));
				break;
			case AtomicCounter:
				addChild(new AtomicCounterLayoutBindingCase(m_context, testName.c_str(),
															"test atomic counters layout binding functionality",
															*stagesIter, *testArgsIter, m_glslVersion));
				break;
			case UniformBlock:
				addChild(new UniformBlocksLayoutBindingCase(m_context, testName.c_str(),
															"test uniform block layout binding functionality",
															*stagesIter, *testArgsIter, m_glslVersion));
				break;
			case ShaderStorageBuffer:
				addChild(new ShaderStorageBufferLayoutBindingCase(
					m_context, testName.c_str(), "test shader storage buffer layout binding functionality", *stagesIter,
					*testArgsIter, m_glslVersion));
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}
	}
}